

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<(anonymous_namespace)::RZ>::resizeErase
          (Array2D<(anonymous_namespace)::RZ> *this,long sizeX,long sizeY)

{
  RZ *pRVar1;
  
  pRVar1 = (RZ *)operator_new__(0x537e8);
  if (this->_data != (RZ *)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = 0xc5;
  this->_sizeY = 0xd9;
  this->_data = pRVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}